

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O0

void __thiscall Lib::DArray<char>::expand(DArray<char> *this,size_t s,char defVal)

{
  char *pcVar1;
  char in_DL;
  ulong in_RSI;
  DArray<char> *in_RDI;
  size_t i;
  size_t oldSize;
  ulong local_28;
  
  local_28 = in_RDI->_size;
  expand(this,s);
  if (local_28 < in_RSI) {
    for (; local_28 < in_RSI; local_28 = local_28 + 1) {
      pcVar1 = operator[](in_RDI,local_28);
      *pcVar1 = in_DL;
    }
  }
  return;
}

Assistant:

void expand(size_t s, C defVal)
  {
    size_t oldSize = _size;
    expand(s);

    if(s<=oldSize) {
      return;
    }

    for(size_t i=oldSize; i<s; i++) {
      (*this)[i] = defVal;
    }
  }